

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

void __thiscall
leveldb::MemTable::Add(MemTable *this,SequenceNumber s,ValueType type,Slice *key,Slice *value)

{
  size_t __n;
  uint64_t v;
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *buf;
  char *local_38;
  
  __n = key->size_;
  v = value->size_;
  iVar1 = VarintLength(__n + 8);
  iVar2 = VarintLength(v);
  local_38 = Arena::Allocate(&this->arena_,v + __n + 8 + (long)iVar2 + (long)iVar1);
  pcVar3 = EncodeVarint32(local_38,(uint32_t)(__n + 8));
  memcpy(pcVar3,key->data_,__n);
  *(ulong *)(pcVar3 + __n) = (ulong)type | s << 8;
  pcVar3 = EncodeVarint32((char *)((long)(pcVar3 + __n) + 8),(uint32_t)v);
  memcpy(pcVar3,value->data_,v);
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Insert(&this->table_,&local_38);
  return;
}

Assistant:

void MemTable::Add(SequenceNumber s, ValueType type, const Slice& key,
                   const Slice& value) {
  // Format of an entry is concatenation of:
  //  key_size     : varint32 of internal_key.size()
  //  key bytes    : char[internal_key.size()]
  //  value_size   : varint32 of value.size()
  //  value bytes  : char[value.size()]
  size_t key_size = key.size();
  size_t val_size = value.size();
  size_t internal_key_size = key_size + 8;
  const size_t encoded_len = VarintLength(internal_key_size) +
                             internal_key_size + VarintLength(val_size) +
                             val_size;
  char* buf = arena_.Allocate(encoded_len);
  char* p = EncodeVarint32(buf, internal_key_size);
  memcpy(p, key.data(), key_size);
  p += key_size;
  EncodeFixed64(p, (s << 8) | type);
  p += 8;
  p = EncodeVarint32(p, val_size);
  memcpy(p, value.data(), val_size);
  assert(p + val_size == buf + encoded_len);
  table_.Insert(buf);
}